

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

Type __thiscall wasm::TypeBuilder::getTempTupleType(TypeBuilder *this,Tuple *tuple)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> this_00;
  type_t type;
  TypeInfo local_40;
  
  this_00._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  anon_unknown_0::TypeInfo::TypeInfo(&local_40,tuple);
  type = anon_unknown_0::Store<wasm::(anonymous_namespace)::TypeInfo>::insert
                   (&(this_00._M_head_impl)->typeStore,&local_40);
  anon_unknown_0::TypeInfo::~TypeInfo(&local_40);
  if (8 < (ulong)((long)(tuple->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(tuple->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    anon_unknown_0::markTemp((Type)type.id);
  }
  return (Type)type.id;
}

Assistant:

Type TypeBuilder::getTempTupleType(const Tuple& tuple) {
  Type ret = impl->typeStore.insert(tuple);
  if (tuple.types.size() > 1) {
    return markTemp(ret);
  } else {
    // No new tuple was created, so the result might not be temporary.
    return ret;
  }
}